

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Path::make(Path *this,Value *root)

{
  bool bVar1;
  Value *in_RSI;
  string *in_RDI;
  PathArgument *arg;
  const_iterator it;
  Value *node;
  ArrayIndex in_stack_000000b4;
  Value *in_stack_000000b8;
  Value *in_stack_ffffffffffffffd0;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_20;
  Value *local_18;
  
  local_18 = in_RSI;
  local_20._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin
                 ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
  while( true ) {
    std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end
              ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (Value *)__gnu_cxx::
                  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                  ::operator*(&local_20);
    if (*(Kind *)((long)&in_stack_ffffffffffffffd0->limit_ + 4) == kindIndex) {
      Value::isArray(local_18);
      local_18 = Value::operator[](in_stack_000000b8,in_stack_000000b4);
    }
    else if (*(Kind *)((long)&in_stack_ffffffffffffffd0->limit_ + 4) == kindKey) {
      Value::isObject(local_18);
      local_18 = Value::operator[](in_stack_ffffffffffffffd0,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&local_20);
  }
  return local_18;
}

Assistant:

Value& Path::make(Value& root) const {
  Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray()) {
        // Error: node is not an array at position ...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: node is not an object at position...
      }
      node = &((*node)[arg.key_]);
    }
  }
  return *node;
}